

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_1::GetErrorCase::expectError
          (GetErrorCase *this,GLenum error0,GLenum error1)

{
  ostringstream *this_00;
  TestLog *pTVar1;
  int iVar2;
  GLenum GVar3;
  undefined4 extraout_var;
  Enum<int,_2UL> local_1e0;
  Enum<int,_2UL> local_1d0;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_138 [264];
  
  iVar2 = (*((this->super_BaseCase).super_ErrorCase.super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  pTVar1 = ((this->super_BaseCase).super_ErrorCase.super_TestCase.super_TestCase.super_TestNode.
           m_testCtx)->m_log;
  GVar3 = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
  if (GVar3 != error1 && GVar3 != error0) {
    local_1b0._0_8_ = local_1a0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,"Incorrect error was reported","");
    tcu::ResultCollector::addResult
              (&(this->super_BaseCase).m_results,QP_TEST_RESULT_FAIL,(string *)local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._0_8_ != local_1a0) {
      operator_delete((void *)local_1b0._0_8_,local_1a0[0]._M_allocated_capacity + 1);
    }
    this_00 = (ostringstream *)(local_1b0 + 8);
    local_1d0.m_value = error0;
    local_1b0._0_8_ = pTVar1;
    if (error0 == error1) {
      std::__cxx11::ostringstream::ostringstream(this_00);
      local_1d0.m_getName = glu::getErrorName;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1d0,(ostream *)this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00," was expected but got ",0x16);
      local_1e0.m_getName = glu::getErrorName;
      local_1e0.m_value = GVar3;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1e0,(ostream *)this_00);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      std::__cxx11::ostringstream::ostringstream(this_00);
      local_1d0.m_getName = glu::getErrorName;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1d0,(ostream *)this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," or ",4);
      local_1e0.m_getName = glu::getErrorName;
      local_1e0.m_value = error1;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1e0,(ostream *)this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00," was expected but got ",0x16);
      local_1c0.m_getName = glu::getErrorName;
      local_1c0.m_value = GVar3;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)this_00);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_138);
  }
  return;
}

Assistant:

void GetErrorCase::expectError (glw::GLenum error0, glw::GLenum error1)
{
	const glw::Functions&	gl		= m_context.getRenderContext().getFunctions();
	TestLog&				log		= m_testCtx.getLog();

	const GLenum			result	= gl.getError();

	if (result != error0 && result != error1)
	{
		m_results.addResult(QP_TEST_RESULT_FAIL, "Incorrect error was reported");
		if (error0 == error1)
			log << TestLog::Message
				<< glu::getErrorStr(error0) << " was expected but got "
				<< glu::getErrorStr(result)
				<< TestLog::EndMessage;
		else
			log << TestLog::Message
				<< glu::getErrorStr(error0) << " or "
				<< glu::getErrorStr(error1) << " was expected but got "
				<< glu::getErrorStr(result)
				<< TestLog::EndMessage;
		return;
	}
}